

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

int av1_get_deltaq_offset(aom_bit_depth_t bit_depth,int qindex,double beta)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  iVar3 = 0;
  iVar1 = av1_dc_quant_QTX(qindex,0,bit_depth);
  iVar2 = (int)iVar1;
  if (beta < 0.0) {
    dVar5 = sqrt(beta);
  }
  else {
    dVar5 = SQRT(beta);
  }
  dVar5 = rint((double)iVar2 / dVar5);
  iVar4 = (int)dVar5;
  if (iVar4 != iVar2) {
    iVar3 = qindex;
    if (iVar4 < iVar2) {
      iVar2 = qindex;
      if (0 < qindex) {
        do {
          iVar3 = iVar2 + -1;
          iVar1 = av1_dc_quant_QTX(iVar3,0,bit_depth);
          if (iVar2 < 2) break;
          iVar2 = iVar3;
        } while (iVar4 < iVar1);
      }
    }
    else {
      iVar2 = qindex;
      if (qindex < 0xff) {
        do {
          iVar3 = iVar2 + 1;
          iVar1 = av1_dc_quant_QTX(iVar3,0,bit_depth);
          if (0xfd < iVar2) break;
          iVar2 = iVar3;
        } while (iVar1 < iVar4);
      }
    }
    iVar3 = iVar3 - qindex;
  }
  return iVar3;
}

Assistant:

int av1_get_deltaq_offset(aom_bit_depth_t bit_depth, int qindex, double beta) {
  assert(beta > 0.0);
  int q = av1_dc_quant_QTX(qindex, 0, bit_depth);
  int newq = (int)rint(q / sqrt(beta));
  int orig_qindex = qindex;
  if (newq == q) {
    return 0;
  }
  if (newq < q) {
    while (qindex > 0) {
      qindex--;
      q = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (newq >= q) {
        break;
      }
    }
  } else {
    while (qindex < MAXQ) {
      qindex++;
      q = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (newq <= q) {
        break;
      }
    }
  }
  return qindex - orig_qindex;
}